

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot_async.cpp
# Opt level: O0

tuple<ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
* eval_args_abi_cxx11_
            (tuple<ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             *__return_storage_ptr__,int argc,char **argv)

{
  char *pcVar1;
  runtime_error *prVar2;
  int *piVar3;
  ostream *poVar4;
  double dVar5;
  double dVar6;
  int local_128;
  Section local_d0;
  ImageSize local_b8;
  int local_b0;
  int local_ac;
  int local_a8;
  allocator<char> local_a1;
  int num_threads;
  string filename;
  undefined1 local_78 [8];
  string colors;
  double height;
  double center_y;
  double center_x;
  int local_38;
  int repetitions;
  int max_iterations;
  int image_height;
  int image_width;
  char **local_20;
  char **argv_local;
  tuple<ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *ptStack_10;
  int argc_local;
  
  local_20 = argv;
  argv_local._4_4_ = argc;
  ptStack_10 = __return_storage_ptr__;
  if ((argc < 10) || (0xb < argc)) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"invalid number of arguments");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  max_iterations = eval_arg<int>(argv[1],1,100000);
  repetitions = eval_arg<int>(local_20[2],1,100000);
  local_38 = eval_arg<int>(local_20[3],1,1000000000);
  center_x._4_4_ = eval_arg<int>(local_20[4],1,1000000);
  dVar5 = eval_arg<double>(local_20[5],-100.0,100.0);
  dVar6 = eval_arg<double>(local_20[6],-100.0,100.0);
  colors.field_2._8_8_ = eval_arg<double>(local_20[7],-100.0,100.0);
  pcVar1 = local_20[8];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,pcVar1,(allocator<char> *)(filename.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(filename.field_2._M_local_buf + 0xf));
  pcVar1 = local_20[9];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&num_threads,pcVar1,&local_a1);
  std::allocator<char>::~allocator(&local_a1);
  if (argv_local._4_4_ == 0xb) {
    local_128 = eval_arg<int>(local_20[10],2,1000);
  }
  else {
    local_ac = std::thread::hardware_concurrency();
    local_ac = local_ac + -2;
    local_b0 = 4;
    piVar3 = std::max<int>(&local_ac,&local_b0);
    local_128 = *piVar3;
  }
  local_a8 = local_128;
  poVar4 = std::operator<<((ostream *)&std::cout,"using ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_a8);
  std::operator<<(poVar4," threads\n");
  if (repetitions < local_a8) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar2,
               "maximum number of threads must not exceed the number of pixel rows of the image");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_b8.width = max_iterations;
  local_b8.height = repetitions;
  local_d0.height = (double)colors.field_2._8_8_;
  local_d0.center_x = dVar5;
  local_d0.center_y = dVar6;
  std::make_tuple<ImageSize,Section,int&,int&,std::__cxx11::string&,std::__cxx11::string&,int&>
            (__return_storage_ptr__,&local_b8,&local_d0,&local_38,(int *)((long)&center_x + 4),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&num_threads,
             &local_a8);
  std::__cxx11::string::~string((string *)&num_threads);
  std::__cxx11::string::~string((string *)local_78);
  return __return_storage_ptr__;
}

Assistant:

auto eval_args(const int argc, char const* argv[])
{
    if (argc < 10 || argc > 11)
        throw std::runtime_error("invalid number of arguments");

    auto image_width    = eval_arg(argv[1], 1, 100000);
    auto image_height   = eval_arg(argv[2], 1, 100000);
    auto max_iterations = eval_arg(argv[3], 1, 1000000000);
    auto repetitions    = eval_arg(argv[4], 1, 1000000);
    auto center_x       = eval_arg(argv[5], -100.0, 100.0);
    auto center_y       = eval_arg(argv[6], -100.0, 100.0);
    auto height         = eval_arg(argv[7], -100.0, 100.0);
    auto colors         = std::string{argv[8]};
    auto filename       = std::string{argv[9]};
    auto num_threads    = (argc == 11) ? eval_arg(argv[10], 2, 1000) : std::max(static_cast<int>(std::thread::hardware_concurrency()) - 2, 4);

    std::cout << "using " << num_threads << " threads\n";

    if (num_threads > image_height)
        throw std::runtime_error("maximum number of threads must not exceed the number of pixel rows of the image");

    return std::make_tuple(ImageSize{image_width, image_height}, Section{center_x, center_y, height}, max_iterations, repetitions, colors, filename, num_threads);
}